

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O0

void __thiscall GcHeap::GcHeapImpl::~GcHeapImpl(GcHeapImpl *this)

{
  GcHeapImpl *this_local;
  
  UnmapTheHeap(this->heap_start,this->number_of_pages << 0xc);
  std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::~list(&this->finalize_queue);
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector(&this->worklist);
  std::
  unordered_map<Sexp_*,_Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>_>
  ::~unordered_map(&this->forwarding_addresses);
  return;
}

Assistant:

~GcHeapImpl() { UnmapTheHeap(heap_start, PAGE_SIZE * number_of_pages); }